

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void __thiscall
Variable_addAndGetEquivalentVariable_Test::TestBody(Variable_addAndGetEquivalentVariable_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  VariablePtr v2;
  VariablePtr v1;
  shared_ptr<libcellml::Variable> local_58;
  AssertHelper local_48 [8];
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  shared_ptr<libcellml::Variable> local_30;
  shared_ptr local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::addEquivalence(local_20,(shared_ptr *)&local_30);
  libcellml::Variable::equivalentVariable((ulong)&local_58);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
            (local_40,"v2","v1->equivalentVariable(0)",&local_30,&local_58);
  if (local_58.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    if (local_58.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') &&
         (local_58.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_58.
                              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
      local_58.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Variable, addAndGetEquivalentVariable)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::Variable::addEquivalence(v1, v2);
    EXPECT_EQ(v2, v1->equivalentVariable(0));
}